

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzinterpolationspace.cpp
# Opt level: O1

void __thiscall
TPZInterpolationSpace::ComputeSolution
          (TPZInterpolationSpace *this,TPZVec<double> *qsi,TPZMaterialDataT<double> *data,
          bool hasPhi)

{
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,hasPhi) != 0) {
    (**(code **)(*(long *)&this->super_TPZCompEl + 0x300))(this,data);
    return;
  }
  (**(code **)(*(long *)&this->super_TPZCompEl + 0x298))(this,data);
  (data->super_TPZMaterialData).fNeedsSol = true;
  (**(code **)(*(long *)&this->super_TPZCompEl + 0x2a8))(this,data,qsi);
  return;
}

Assistant:

void TPZInterpolationSpace::ComputeSolution(TPZVec<REAL> &qsi,
									TPZMaterialDataT<STATE> &data,
									bool hasPhi){
	if(hasPhi){
		this->ReallyComputeSolution(data);
	}else{
		this->InitMaterialData(data);
		data.fNeedsSol=true;
		this->ComputeRequiredData(data,qsi);
	}
}